

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3tokBestIndexMethod(sqlite3_vtab *pVTab,sqlite3_index_info *pInfo)

{
  int i;
  sqlite3_index_info *pInfo_local;
  sqlite3_vtab *pVTab_local;
  
  i = 0;
  while( true ) {
    if (pInfo->nConstraint <= i) {
      pInfo->idxNum = 0;
      return 0;
    }
    if (((pInfo->aConstraint[i].usable != '\0') && (pInfo->aConstraint[i].iColumn == 0)) &&
       (pInfo->aConstraint[i].op == '\x02')) break;
    i = i + 1;
  }
  pInfo->idxNum = 1;
  pInfo->aConstraintUsage[i].argvIndex = 1;
  pInfo->aConstraintUsage[i].omit = '\x01';
  pInfo->estimatedCost = 1.0;
  return 0;
}

Assistant:

static int fts3tokBestIndexMethod(
  sqlite3_vtab *pVTab,
  sqlite3_index_info *pInfo
){
  int i;
  UNUSED_PARAMETER(pVTab);

  for(i=0; i<pInfo->nConstraint; i++){
    if( pInfo->aConstraint[i].usable
     && pInfo->aConstraint[i].iColumn==0
     && pInfo->aConstraint[i].op==SQLITE_INDEX_CONSTRAINT_EQ
    ){
      pInfo->idxNum = 1;
      pInfo->aConstraintUsage[i].argvIndex = 1;
      pInfo->aConstraintUsage[i].omit = 1;
      pInfo->estimatedCost = 1;
      return SQLITE_OK;
    }
  }

  pInfo->idxNum = 0;
  assert( pInfo->estimatedCost>1000000.0 );

  return SQLITE_OK;
}